

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

cf_bool_t string_stream_read(void *stream,cf_char_t *buff,cf_size_t size)

{
  char cVar1;
  long lVar2;
  size_t i;
  
  i = 0;
  while( true ) {
    lVar2 = *(long *)((long)stream + 8);
    cVar1 = *(char *)(*stream + lVar2);
    if ((cVar1 == '\0') || (size <= i)) break;
    *(long *)((long)stream + 8) = lVar2 + 1;
    buff[i] = *(cf_char_t *)(*stream + lVar2);
    i = i + 1;
  }
  return (cf_bool_t)(cVar1 != '\0');
}

Assistant:

cf_bool_t string_stream_read(void* stream, cf_char_t* buff, cf_size_t size) {
    string_stream_t* s = CF_TYPE_CAST(string_stream_t*, stream);
    size_t i = 0;
    while (s->str[s->read] != '\0' && i < size) {
        buff[i++] = s->str[s->read++];
    }
    if (s->str[s->read] == '\0') {
        return CF_FALSE;
    }

    return CF_TRUE;
}